

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_extension_operator.cpp
# Opt level: O2

string * __thiscall
duckdb::LogicalExtensionOperator::GetExtensionName_abi_cxx11_
          (string *__return_storage_ptr__,LogicalExtensionOperator *this)

{
  SerializationException *this_00;
  allocator local_39;
  string local_38;
  
  this_00 = (SerializationException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_38,
             "LogicalExtensionOperator::GetExtensionName not implemented which is required for serializing extension operators"
             ,&local_39);
  SerializationException::SerializationException(this_00,&local_38);
  __cxa_throw(this_00,&SerializationException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

string LogicalExtensionOperator::GetExtensionName() const {
	throw SerializationException("LogicalExtensionOperator::GetExtensionName not implemented which is required for "
	                             "serializing extension operators");
}